

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::ParseVarintTest_Varint64_Test::TestBody
          (ParseVarintTest_Varint64_Test *this)

{
  unsigned_long value_00;
  uint64_t value;
  uint64_t *__end3;
  uint64_t *__begin3;
  uint64_t (*__range3) [5];
  uint64_t values [5];
  int local_24;
  uint64_t uStack_20;
  int varint_length;
  uint64_t base;
  ParseVarintTest_Varint64_Test *pPStack_10;
  anon_class_1_0_00000001 test_value;
  ParseVarintTest_Varint64_Test *this_local;
  
  uStack_20 = 0x49;
  pPStack_10 = this;
  for (local_24 = 1; local_24 < 0xb; local_24 = local_24 + 1) {
    __range3 = (uint64_t (*) [5])(uStack_20 - 0x49);
    values[0] = uStack_20 - 0x48;
    values[1] = uStack_20;
    values[2] = uStack_20 + 0x35;
    values[3] = uStack_20 + 0x36;
    for (__end3 = (uint64_t *)&__range3; __end3 != values + 4; __end3 = __end3 + 1) {
      TestBody::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)((long)&base + 7),*__end3,local_24);
    }
    uStack_20 = uStack_20 * 0x80 + 0x49;
  }
  value_00 = std::numeric_limits<unsigned_long>::max();
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)((long)&base + 7),value_00,10);
  return;
}

Assistant:

TEST(ParseVarintTest, Varint64) {
  auto test_value = [](uint64_t value, int varint_length) {
    uint8_t buffer[10] = {0};
    uint8_t* p = io::CodedOutputStream::WriteVarint64ToArray(value, buffer);
    ASSERT_EQ(p - buffer, varint_length) << "Value = " << value;

    const char* cbuffer = reinterpret_cast<const char*>(buffer);
    uint64_t parsed = ~value;
    const char* r = internal::VarintParse(cbuffer, &parsed);
    ASSERT_EQ(r - cbuffer, varint_length) << "Value = " << value;
    ASSERT_EQ(parsed, value);
  };

  uint64_t base = 73;  // 1001011b
  for (int varint_length = 1; varint_length <= 10; ++varint_length) {
    uint64_t values[] = {
        base - 73, base - 72, base, base + 126 - 73, base + 126 - 72,
    };
    for (uint64_t value : values) {
      test_value(value, varint_length);
    }
    base = (base << 7) + 73;
  }

  test_value(std::numeric_limits<uint64_t>::max(), 10);
}